

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O1

qsizetype __thiscall
QByteArrayMatcher::indexIn(QByteArrayMatcher *this,QByteArrayView data,qsizetype from)

{
  ulong uVar1;
  uchar *puVar2;
  bool bVar3;
  long lVar4;
  qsizetype qVar5;
  storage_type *psVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  char cVar13;
  long lVar14;
  byte *unaff_R13;
  
  psVar6 = data.m_data;
  lVar7 = 0;
  if (0 < from) {
    lVar7 = from;
  }
  uVar1 = (this->field_2).p.l;
  if (uVar1 == 0) {
    qVar5 = -1;
    if (lVar7 <= data.m_size) {
      qVar5 = lVar7;
    }
    return qVar5;
  }
  puVar2 = (this->field_2).p.p;
  pbVar12 = (byte *)(psVar6 + uVar1 + lVar7 + -1);
  pbVar10 = (byte *)(psVar6 + data.m_size);
  do {
    if (pbVar10 <= pbVar12) {
      return -1;
    }
    uVar8 = (ulong)*(byte *)((long)&this->field_2 + (ulong)*pbVar12);
    if (uVar8 == 0) {
      if ((long)uVar1 < 1) {
        lVar7 = 0;
      }
      else {
        bVar9 = *pbVar12;
        if (bVar9 == puVar2[uVar1 - 1]) {
          lVar14 = 0;
          do {
            lVar7 = -uVar1;
            if (1 - uVar1 == lVar14) goto LAB_0030c5b8;
            bVar9 = pbVar12[lVar14 + -1];
            lVar7 = lVar14 + -1;
            lVar4 = lVar14 + (uVar1 - 2);
            lVar14 = lVar7;
          } while (bVar9 == puVar2[lVar4]);
          lVar14 = -lVar7;
          bVar3 = lVar14 < (long)uVar1;
        }
        else {
          lVar14 = 0;
          lVar7 = 0;
          bVar3 = 0 < (long)uVar1;
        }
        if (bVar3) {
          uVar8 = uVar1 - lVar14;
          if (uVar1 != *(byte *)((long)&this->field_2 + (ulong)bVar9)) {
            uVar8 = 1;
          }
          goto LAB_0030c51e;
        }
      }
LAB_0030c5b8:
      unaff_R13 = pbVar12 + (lVar7 - (long)psVar6) + 1;
      cVar13 = '\x01';
    }
    else {
LAB_0030c51e:
      uVar11 = 0;
      if (pbVar12 <= pbVar10 + -uVar8) {
        uVar11 = uVar8;
      }
      bVar3 = pbVar10 + -uVar8 < pbVar12;
      pbVar12 = pbVar12 + uVar11;
      cVar13 = bVar3 * '\x03';
    }
    if (cVar13 != '\0') {
      pbVar10 = (byte *)0xffffffffffffffff;
      if (cVar13 != '\x03') {
        pbVar10 = unaff_R13;
      }
      return (qsizetype)pbVar10;
    }
  } while( true );
}

Assistant:

qsizetype QByteArrayMatcher::indexIn(QByteArrayView data, qsizetype from) const
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(data.data()), data.size(), from,
                   p.p, p.l, p.q_skiptable);
}